

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall
Clasp::Solver::resolveToFlagged(Solver *this,LitVec *in,uint8 vf,LitVec *out,uint32 *outLbd)

{
  Literal p;
  uint32 uVar1;
  pointer pLVar2;
  pointer puVar3;
  SolverStrategies SVar4;
  pointer pDVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  size_type sVar9;
  ulong uVar10;
  undefined7 in_register_00000011;
  size_type i;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  Literal local_54;
  uint32 *local_50;
  LitVec temp;
  
  temp.ebo_.buf = (pointer)0x0;
  temp.ebo_.size = 0;
  temp.ebo_.cap = 0;
  (out->ebo_).size = 0;
  uVar11 = (this->assign_).trail.ebo_.size;
  bVar6 = true;
  iVar8 = 0;
  bVar7 = 0;
  local_50 = outLbd;
  do {
    pLVar2 = (in->ebo_).buf;
    uVar12 = (in->ebo_).size;
    for (lVar19 = 0; uVar18 = (uint)CONCAT71(in_register_00000011,vf), (ulong)uVar12 << 2 != lVar19;
        lVar19 = lVar19 + 4) {
      uVar16 = *(uint *)((long)&pLVar2->rep_ + lVar19);
      puVar3 = (this->assign_).assign_.ebo_.buf;
      uVar17 = *(uint *)((long)puVar3 + (ulong)(uVar16 & 0xfffffffc));
      if ((uVar17 & 0xc) == 0) {
        uVar13 = uVar16 >> 2;
        puVar3[uVar13] = uVar17 | 0xc;
        uVar14 = 0;
        if (uVar13 < (this->shared_->varInfo_).ebo_.size) {
          uVar14 = (uint)(this->shared_->varInfo_).ebo_.buf[uVar13].rep;
        }
        if ((uVar18 & ~uVar14) == 0) {
          local_54.rep_ = uVar16 & 0xfffffffe ^ (uint)bVar7 * 2;
          pDVar5 = (this->levels_).super_type.ebo_.buf + ((uVar17 >> 4) - 1);
          *(uint *)pDVar5 = *(uint *)pDVar5 | 0x40000000;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (out,&local_54);
        }
        else {
          if ((this->assign_).reason_.super_type.ebo_.buf[uVar13].data_ == 0) {
            puVar3[uVar13] = uVar17;
            bVar6 = false;
            break;
          }
          iVar8 = iVar8 + 1;
        }
      }
    }
    bVar20 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if (bVar20) {
      uVar11 = (out->ebo_).size;
      uVar10 = (ulong)uVar11;
      if ((bVar7 & bVar6) != 0) {
        SVar4 = this->strategy_;
        this->strategy_ = (SolverStrategies)((ulong)SVar4 | 0x400000000000);
        if (this->ccMin_ != (CCMinRecursive *)0x0) {
          ccMinRecurseInit(this,this->ccMin_);
        }
        uVar12 = 0;
        while (uVar11 = (uint)uVar10, uVar11 != uVar12) {
          bVar20 = ccRemovable(this,(Literal)((out->ebo_).buf[uVar12].rep_ & 0xfffffffe ^ 2),0,
                               this->ccMin_);
          if (bVar20) {
            pLVar2 = (out->ebo_).buf;
            uVar10 = (ulong)(uVar11 - 1);
            uVar1 = pLVar2[uVar12].rep_;
            pLVar2[uVar12].rep_ = pLVar2[uVar10].rep_;
            pLVar2[uVar10].rep_ = uVar1;
          }
          else {
            uVar12 = uVar12 + 1;
          }
        }
        this->strategy_ =
             (SolverStrategies)
             ((ulong)this->strategy_ & 0xffffbfffffffffff | (ulong)SVar4 & 0x400000000000);
      }
      if (bVar6 == true && uVar11 == 0) {
        Potassco::fail(-1,
                       "bool Clasp::Solver::resolveToFlagged(const LitVec &, const uint8, LitVec &, uint32 &)"
                       ,0x48a,"!ok || outSize != 0","Invalid empty clause - was %u!\n",
                       (ulong)(out->ebo_).size,0);
      }
      *local_50 = 0;
      iVar8 = 0;
      for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        puVar3 = (this->assign_).assign_.ebo_.buf;
        uVar15 = (ulong)((out->ebo_).buf[uVar10].rep_ & 0xfffffffc);
        uVar12 = *(uint *)((long)puVar3 + uVar15);
        *(uint *)((long)puVar3 + uVar15) = uVar12 & 0xfffffff3;
        if (0xf < uVar12) {
          uVar12 = uVar12 >> 4;
          pDVar5 = (this->levels_).super_type.ebo_.buf;
          uVar18 = *(uint *)(&pDVar5[-1].field_0x0 + (uVar12 << 4));
          if ((uVar18 >> 0x1e & 1) != 0) {
            *(uint *)(&pDVar5[-1].field_0x0 + (uVar12 << 4)) = uVar18 & 0xbfffffff;
            uVar18 = (this->levels_).root;
            bVar20 = iVar8 == 0;
            iVar8 = iVar8 + (uint)(uVar12 <= uVar18);
            *local_50 = *local_50 + (uint)(bVar20 || uVar18 < uVar12);
          }
        }
      }
      sVar9 = (out->ebo_).size;
      while (uVar11 != sVar9) {
        puVar3 = (this->assign_).assign_.ebo_.buf;
        uVar10 = (ulong)((out->ebo_).buf[sVar9 - 1].rep_ & 0xfffffffc);
        uVar12 = *(uint *)((long)puVar3 + uVar10);
        *(uint *)((long)puVar3 + uVar10) = uVar12 & 0xfffffff3;
        pDVar5 = (this->levels_).super_type.ebo_.buf + ((uVar12 >> 4) - 1);
        *(uint *)pDVar5 = *(uint *)pDVar5 & 0xbfffffff;
        sVar9 = (out->ebo_).size - 1;
        (out->ebo_).size = sVar9;
      }
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(&temp.ebo_);
      return bVar6;
    }
    puVar3 = (this->assign_).assign_.ebo_.buf;
    do {
      do {
        uVar11 = uVar11 - 1;
        p.rep_ = (this->assign_).trail.ebo_.buf[uVar11].rep_;
        uVar12 = *(uint *)((long)puVar3 + (ulong)(p.rep_ & 0xfffffffc));
      } while (((p.rep_ & 2) * 2 + 4 & uVar12) == 0);
      uVar16 = p.rep_ >> 2;
      uVar17 = 0;
      if (uVar16 < (this->shared_->varInfo_).ebo_.size) {
        uVar17 = (uint)(this->shared_->varInfo_).ebo_.buf[uVar16].rep;
      }
    } while ((uVar18 & ~uVar17) == 0);
    puVar3[uVar16] = uVar12 & 0xfffffff3;
    bVar7 = 1;
    in = &temp;
    reason(this,p,in);
  } while( true );
}

Assistant:

bool Solver::resolveToFlagged(const LitVec& in, const uint8 vf, LitVec& out, uint32& outLbd) {
	const LitVec& trail = assign_.trail;
	const LitVec* rhs   = &in;
	LitVec temp; out.clear();
	bool ok = true, first = true;
	for (LitVec::size_type tp = trail.size(), resolve = 0;; first = false) {
		Literal p; Var v;
		for (LitVec::const_iterator it = rhs->begin(), end = rhs->end(); it != end; ++it) {
			p = *it ^ first; v = p.var();
			if (!seen(v)) {
				markSeen(v);
				if      (varInfo(v).hasAll(vf)) { markLevel(level(v)); out.push_back(~p); }
				else if (!reason(p).isNull())   { ++resolve; }
				else                            { clearSeen(v); ok = false; break; }
			}
		}
		if (resolve-- == 0) { break; }
		// find next literal to resolve
		while (!seen(trail[--tp]) || varInfo(trail[tp].var()).hasAll(vf)) { ; }
		clearSeen((p = trail[tp]).var());
		reason(p, temp);
		rhs = &temp;
	}
	LitVec::size_type outSize = out.size();
	if (ok && !first) {
		const uint32 ccAct = strategy_.ccMinKeepAct;
		const uint32 antes = SolverStrategies::all_antes;
		strategy_.ccMinKeepAct = 1;
		if (ccMin_) { ccMinRecurseInit(*ccMin_); }
		for (LitVec::size_type i = 0; i != outSize;) {
			if (!ccRemovable(~out[i], antes, ccMin_)) { ++i; }
			else {
				std::swap(out[i], out[--outSize]);
			}
		}
		strategy_.ccMinKeepAct = ccAct;
	}
	POTASSCO_ASSERT(!ok || outSize != 0, "Invalid empty clause - was %u!\n", out.size());
	outLbd = 0;
	for (uint32 i = 0, dl, root = 0; i != outSize; ++i) {
		Var v = out[i].var();
		dl    = level(v);
		clearSeen(v);
		if (dl && hasLevel(dl)) {
			unmarkLevel(dl);
			outLbd += (dl > rootLevel()) || (++root == 1);
		}
	}
	for (Var v; outSize != out.size(); out.pop_back()) {
		clearSeen(v = out.back().var());
		unmarkLevel(level(v));
	}
	return ok;
}